

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.hpp
# Opt level: O0

void __thiscall
foxxll::disk_block_allocator::disk_block_allocator
          (disk_block_allocator *this,file *storage,disk_config *cfg)

{
  disk_config *cfg_local;
  file *storage_local;
  disk_block_allocator *this_local;
  
  std::mutex::mutex(&this->mutex_);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map(&this->free_space_);
  this->free_bytes_ = 0;
  this->disk_bytes_ = 0;
  this->cfg_bytes_ = cfg->size;
  this->storage_ = storage;
  this->autogrow_ = (bool)(cfg->autogrow & 1);
  grow_file(this,cfg->size);
  return;
}

Assistant:

disk_block_allocator(file* storage, const disk_config& cfg)
        : cfg_bytes_(cfg.size),
          storage_(storage),
          autogrow_(cfg.autogrow)
    {
        // initial growth to configured file size
        grow_file(cfg.size);
    }